

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::removedCoVecs(SPxSteepPR<double> *this,int *perm)

{
  int iVar1;
  double *pdVar2;
  long in_RSI;
  undefined8 in_RDI;
  VectorBase<double> *unaff_retaddr;
  int j;
  int i;
  VectorBase<double> *coWeights;
  undefined8 in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x2ad1a1);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    if (-1 < *(int *)(in_RSI + (long)local_1c * 4)) {
      pdVar2 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20))
      ;
      in_stack_ffffffffffffffd0 = (VectorBase<double> *)*pdVar2;
      pdVar2 = VectorBase<double>::operator[]
                         (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20))
      ;
      *pdVar2 = (double)in_stack_ffffffffffffffd0;
    }
  }
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2ad226);
  VectorBase<double>::reDim
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVecs(const int perm[])
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   int i;
   int j = coWeights.dim();

   for(i = 0; i < j; ++i)
   {
      if(perm[i] >= 0)
         coWeights[perm[i]] = coWeights[i];
   }

   coWeights.reDim(this->thesolver->dim());
}